

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

Iso_Man_t * Iso_ManStart(Aig_Man_t *pAig)

{
  int iVar1;
  Iso_Man_t *pIVar2;
  Iso_Obj_t *pIVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  Iso_Man_t *p;
  Aig_Man_t *pAig_local;
  
  pIVar2 = (Iso_Man_t *)calloc(1,0x78);
  pIVar2->pAig = pAig;
  iVar1 = Aig_ManObjNumMax(pAig);
  pIVar2->nObjs = iVar1;
  pIVar3 = (Iso_Obj_t *)calloc((long)pIVar2->nObjs,0x18);
  pIVar2->pObjs = pIVar3;
  iVar1 = Abc_PrimeCudd(pIVar2->nObjs);
  pIVar2->nBins = iVar1;
  piVar4 = (int *)calloc((long)pIVar2->nBins,4);
  pIVar2->pBins = piVar4;
  pVVar5 = Vec_PtrAlloc(1000);
  pIVar2->vSingles = pVVar5;
  pVVar5 = Vec_PtrAlloc(1000);
  pIVar2->vClasses = pVVar5;
  pVVar5 = Vec_PtrAlloc(1000);
  pIVar2->vTemp1 = pVVar5;
  pVVar5 = Vec_PtrAlloc(1000);
  pIVar2->vTemp2 = pVVar5;
  pIVar2->nObjIds = 1;
  return pIVar2;
}

Assistant:

Iso_Man_t * Iso_ManStart( Aig_Man_t * pAig )
{
    Iso_Man_t * p;
    p = ABC_CALLOC( Iso_Man_t, 1 );
    p->pAig     = pAig;
    p->nObjs    = Aig_ManObjNumMax( pAig );
    p->pObjs    = ABC_CALLOC( Iso_Obj_t, p->nObjs );
    p->nBins    = Abc_PrimeCudd( p->nObjs );
    p->pBins    = ABC_CALLOC( int, p->nBins );    
    p->vSingles = Vec_PtrAlloc( 1000 );
    p->vClasses = Vec_PtrAlloc( 1000 );
    p->vTemp1   = Vec_PtrAlloc( 1000 );
    p->vTemp2   = Vec_PtrAlloc( 1000 );
    p->nObjIds  = 1;
    return p;
}